

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_vmt.c
# Opt level: O0

void gga_x_vmt_init(xc_func_type *p)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *in_RDI;
  gga_x_vmt_params *params;
  
  pvVar2 = malloc(0x10);
  in_RDI[0x2f] = pvVar2;
  puVar1 = (undefined8 *)in_RDI[0x2f];
  if (*(int *)*in_RDI == 0x46) {
    *puVar1 = 0x3fbf9add3c0ca458;
    puVar1[1] = 0x3f5971c10d7be985;
  }
  else {
    if (*(int *)*in_RDI != 0x47) {
      fprintf(_stderr,"Internal error in gga_x_vmt\n");
      exit(1);
    }
    *puVar1 = 0x3fcc19110e80c25e;
    puVar1[1] = 0x3f66a055757d5a9f;
  }
  return;
}

Assistant:

static void
gga_x_vmt_init(xc_func_type *p)
{
  gga_x_vmt_params *params;

  assert(p != NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_x_vmt_params));
  params = (gga_x_vmt_params *) (p->params);

  switch(p->info->number){
  case XC_GGA_X_VMT_PBE:
    params->mu    = 0.2195149727645171;
    params->alpha = 0.002762;
    break;
  case XC_GGA_X_VMT_GE:
    params->mu = 10.0/81.0;
    params->alpha = 0.001553;
    break;
  default:
    fprintf(stderr, "Internal error in gga_x_vmt\n");
    exit(1);
  }
}